

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_TxSizeByException_Test::TestBody
          (AbstractTransaction_TxSizeByException_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  TestTransaction tx;
  Message local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  code *local_18;
  void *local_10;
  
  TestTransaction::TestTransaction((TestTransaction *)&local_18);
  local_38.ss_.ptr_._0_4_ = cfd::core::AbstractTransaction::GetTotalSize();
  local_30.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_28,"tx.GetTotalSize()","10",(uint *)&local_38,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ss_.ptr_._0_4_ = cfd::core::AbstractTransaction::GetVsize();
  local_30.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_28,"tx.GetVsize()","10",(uint *)&local_38,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x13e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ss_.ptr_._0_4_ = cfd::core::AbstractTransaction::GetWeight();
  local_30.data_._0_4_ = 0x28;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_28,"tx.GetWeight()","40",(uint *)&local_38,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_18 = cfd::core::Script::GetElementList;
  cfd::core::AbstractTransaction::FreeWallyAddress(local_10);
  return;
}

Assistant:

TEST(AbstractTransaction, TxSizeByException) {
  TestTransaction tx;
  EXPECT_EQ(tx.GetTotalSize(), 10);
  EXPECT_EQ(tx.GetVsize(), 10);
  EXPECT_EQ(tx.GetWeight(), 40);
}